

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O0

CordRep * absl::lts_20250127::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *tree,size_t n)

{
  ulong uVar1;
  bool bVar2;
  size_t n_00;
  CordRep *pCVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  CopyResult CVar6;
  size_t local_98;
  size_t local_90;
  CordRep *pCStack_70;
  bool edge_is_mutable;
  CordRep *edge;
  CordRepBtree *top;
  CordRep *edge_1;
  Position pos;
  bool is_mutable;
  size_t sStack_30;
  int height;
  size_t length;
  size_t len;
  size_t n_local;
  CordRepBtree *tree_local;
  
  if (tree == (CordRepBtree *)0x0) {
    __assert_fail("tree != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x34b,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  if ((tree->super_CordRep).length < n) {
    __assert_fail("n <= tree->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x34c,
                  "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                 );
  }
  uVar1 = (tree->super_CordRep).length;
  tree_local = tree;
  if (n != 0) {
    if (n < uVar1) {
      n_00 = uVar1 - n;
      pos.n._4_4_ = CordRepBtree::height(tree);
      pos.n._3_1_ = RefcountAndFlags::IsOne(&(tree->super_CordRep).refcount);
      _edge_1 = IndexOfLength(tree,n_00);
      n_local = (size_t)tree;
      while( true ) {
        pCVar3 = (CordRep *)begin((CordRepBtree *)n_local);
        if (edge_1 != pCVar3) break;
        pCVar3 = ExtractFront((CordRepBtree *)n_local);
        bVar2 = RefcountAndFlags::IsOne(&pCVar3->refcount);
        pos.n._3_1_ = (pos.n._3_1_ & bVar2) != 0;
        if (pos.n._4_4_ == 0) {
          pCVar3 = cord_internal::anon_unknown_0::ResizeEdge(pCVar3,n_00,pos.n._3_1_);
          return pCVar3;
        }
        n_local = (size_t)CordRep::btree(pCVar3);
        _edge_1 = IndexOfLength((CordRepBtree *)n_local,n_00);
        pos.n._4_4_ = pos.n._4_4_ + -1;
      }
      pCVar4 = ConsumeBeginTo((CordRepBtree *)n_local,(size_t)((long)&edge_1->length + 1),n_00);
      pCStack_70 = Edge(pCVar4,(size_t)edge_1);
      sStack_30 = pos.index;
      n_local = (size_t)pCVar4;
      while (sStack_30 != pCStack_70->length) {
        bVar2 = RefcountAndFlags::IsOne((RefcountAndFlags *)(n_local + 8));
        if (!bVar2) {
          __assert_fail("tree->refcount.IsOne()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                        ,0x36e,
                        "static CordRep *absl::cord_internal::CordRepBtree::RemoveSuffix(CordRepBtree *, size_t)"
                       );
        }
        bVar2 = RefcountAndFlags::IsOne(&pCStack_70->refcount);
        if (pos.n._4_4_ == 0) {
          pCVar3 = cord_internal::anon_unknown_0::ResizeEdge(pCStack_70,sStack_30,bVar2);
          *(CordRep **)(n_local + 0x10 + (long)edge_1 * 8) = pCVar3;
          pCVar4 = AssertValid(pCVar4,true);
          return &pCVar4->super_CordRep;
        }
        if (!bVar2) {
          pCVar5 = CordRep::btree(pCStack_70);
          CVar6 = CopyPrefix(pCVar5,sStack_30,false);
          *(CordRep **)(n_local + 0x10 + (long)edge_1 * 8) = CVar6.edge;
          CordRep::Unref(pCStack_70);
          pCVar4 = AssertValid(pCVar4,true);
          return &pCVar4->super_CordRep;
        }
        pCVar5 = CordRep::btree(pCStack_70);
        _edge_1 = IndexOfLength(pCVar5,sStack_30);
        local_98 = edge_1;
        local_90 = edge_1._8_8_;
        pCVar5 = CordRep::btree(pCStack_70);
        n_local = (size_t)ConsumeBeginTo(pCVar5,local_98 + 1,sStack_30);
        pCStack_70 = Edge((CordRepBtree *)n_local,local_98);
        pos.n._4_4_ = pos.n._4_4_ + -1;
        sStack_30 = local_90;
      }
      tree_local = AssertValid(pCVar4,true);
    }
    else {
      CordRep::Unref(&tree->super_CordRep);
      tree_local = (CordRepBtree *)0x0;
    }
  }
  return &tree_local->super_CordRep;
}

Assistant:

CordRep* CordRepBtree::RemoveSuffix(CordRepBtree* tree, size_t n) {
  // Check input and deal with trivial cases 'Remove all/none'
  assert(tree != nullptr);
  assert(n <= tree->length);
  const size_t len = tree->length;
  if (ABSL_PREDICT_FALSE(n == 0)) {
    return tree;
  }
  if (ABSL_PREDICT_FALSE(n >= len)) {
    CordRepBtree::Unref(tree);
    return nullptr;
  }

  size_t length = len - n;
  int height = tree->height();
  bool is_mutable = tree->refcount.IsOne();

  // Extract all top nodes which are reduced to size = 1
  Position pos = tree->IndexOfLength(length);
  while (pos.index == tree->begin()) {
    CordRep* edge = ExtractFront(tree);
    is_mutable &= edge->refcount.IsOne();
    if (height-- == 0) return ResizeEdge(edge, length, is_mutable);
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
  }

  // Repeat the following sequence traversing down the tree:
  // - Crop the top node to the 'last remaining edge' adjusting length.
  // - Set the length for down edges to the partial length in that last edge.
  // - Repeat this until the last edge is 'included in full'
  // - If we hit the data edge level, resize and return the last data edge
  CordRepBtree* top = tree = ConsumeBeginTo(tree, pos.index + 1, length);
  CordRep* edge = tree->Edge(pos.index);
  length = pos.n;
  while (length != edge->length) {
    // ConsumeBeginTo guarantees `tree` is a clean, privately owned copy.
    assert(tree->refcount.IsOne());
    const bool edge_is_mutable = edge->refcount.IsOne();

    if (height-- == 0) {
      tree->edges_[pos.index] = ResizeEdge(edge, length, edge_is_mutable);
      return AssertValid(top);
    }

    if (!edge_is_mutable) {
      // We can't 'in place' remove any suffixes down this edge.
      // Replace this edge with a prefix copy instead.
      tree->edges_[pos.index] = edge->btree()->CopyPrefix(length, false).edge;
      CordRep::Unref(edge);
      return AssertValid(top);
    }

    // Move down one level, rinse repeat.
    tree = edge->btree();
    pos = tree->IndexOfLength(length);
    tree = ConsumeBeginTo(edge->btree(), pos.index + 1, length);
    edge = tree->Edge(pos.index);
    length = pos.n;
  }

  return AssertValid(top);
}